

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O2

llparse_match_t
llparse__match_sequence_to_lower
          (llhttp__internal_t *s,uchar *p,uchar *endp,uchar *seq,uint32_t seq_len)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  ulong in_RAX;
  uint uVar4;
  char cVar5;
  byte bVar6;
  llparse_match_t lVar7;
  
  uVar4 = s->_index;
  do {
    if (p == endp) {
      in_RAX = 1;
      p = endp;
LAB_0010794c:
      s->_index = uVar4;
LAB_0010794e:
      lVar7.current = p;
      lVar7._0_8_ = in_RAX;
      return lVar7;
    }
    bVar2 = *p;
    bVar6 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar6 = bVar2;
    }
    uVar1 = uVar4 + 1;
    uVar3 = 0;
    if (uVar1 != seq_len) {
      uVar3 = in_RAX & 0xffffffff;
    }
    in_RAX = uVar3;
    bVar2 = seq[uVar4];
    if (bVar6 != bVar2) {
      in_RAX = 2;
    }
    cVar5 = (uVar1 == seq_len) * '\x05';
    if (bVar6 != bVar2) {
      cVar5 = '\x05';
    }
    if (cVar5 != '\0') {
      if (cVar5 != '\x05') goto LAB_0010794e;
      uVar4 = 0;
      goto LAB_0010794c;
    }
    if (bVar6 != bVar2) {
      uVar1 = uVar4;
    }
    uVar4 = uVar1;
    p = p + 1;
  } while( true );
}

Assistant:

static llparse_match_t llparse__match_sequence_to_lower(
    llhttp__internal_t* s, const unsigned char* p,
    const unsigned char* endp,
    const unsigned char* seq, uint32_t seq_len) {
  uint32_t index;
  llparse_match_t res;

  index = s->_index;
  for (; p != endp; p++) {
    unsigned char current;

    current = ((*p) >= 'A' && (*p) <= 'Z' ? (*p | 0x20) : (*p));
    if (current == seq[index]) {
      if (++index == seq_len) {
        res.status = kMatchComplete;
        goto reset;
      }
    } else {
      res.status = kMatchMismatch;
      goto reset;
    }
  }
  s->_index = index;
  res.status = kMatchPause;
  res.current = p;
  return res;
reset:
  s->_index = 0;
  res.current = p;
  return res;
}